

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_crl.cpp
# Opt level: O2

void WriteGeneralName(GeneralName *name)

{
  size_t *this;
  string *this_00;
  GeneralNameType GVar1;
  ostream *poVar2;
  stringstream local_210 [8];
  stringstream strstm;
  ostream local_200 [376];
  undefined1 local_88 [8];
  IA5String uri;
  size_type *local_38;
  string str;
  
  GVar1 = GeneralName::GetType(name);
  if (GVar1 == uniformResourceIdentifier) {
    this = &uri.super_DerBase.cbData;
    uri.super_DerBase._vptr_DerBase = (_func_int **)0x0;
    local_88 = (undefined1  [8])&PTR_EncodedSize_00146b58;
    uri.super_DerBase.cbData = (size_t)&uri.value._M_string_length;
    uri.value._M_dataplus._M_p = (pointer)0x0;
    uri.value._M_string_length._0_1_ = 0;
    local_38 = &str._M_string_length;
    str._M_dataplus._M_p = (pointer)0x0;
    str._M_string_length._0_1_ = 0;
    GeneralName::GetURI(name,(IA5String *)local_88);
    std::__cxx11::stringstream::stringstream(local_210);
    std::operator<<(local_200,(string *)this);
    std::__cxx11::stringbuf::str();
    this_00 = (string *)(uri.value.field_2._M_local_buf + 8);
    std::__cxx11::string::operator=((string *)&local_38,this_00);
    std::__cxx11::string::~string(this_00);
    poVar2 = std::operator<<((ostream *)&std::cout,"CRL URI: ");
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringstream::~stringstream(local_210);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)this);
  }
  return;
}

Assistant:

void WriteGeneralName(const GeneralName& name)
{
    GeneralNameType type = name.GetType();

    switch(type)
    {
        case GeneralNameType::uniformResourceIdentifier:
            break;
            
        case GeneralNameType::OtherName:
        case GeneralNameType::rfc822Name:
        case GeneralNameType::dNSName:
        case GeneralNameType::x400Address:
        case GeneralNameType::directoryName:
        case GeneralNameType::ediPartyName:
        case GeneralNameType::iPAddress:
        case GeneralNameType::registeredID:
        default:
            return;
    }

    IA5String uri;
    std::string str;

    name.GetURI(uri);
    std::stringstream strstm;
    strstm << uri;
    str = strstm.str();

    std::cout << "CRL URI: " << str << std::endl;
}